

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O1

void qt_rectfill<unsigned_long_long>
               (unsigned_long_long *dest,unsigned_long_long value,int x,int y,int width,int height,
               qsizetype stride)

{
  undefined4 in_register_00000084;
  long lVar1;
  
  lVar1 = (long)x;
  if ((ulong)(uint)width != lVar1 * 8) {
    if (0 < y) {
      do {
        (*qt_memfill64)(dest,value,lVar1);
        dest = (unsigned_long_long *)((long)dest + CONCAT44(in_register_00000084,width));
        y = y + -1;
      } while (y != 0);
    }
    return;
  }
  (*qt_memfill64)(dest,value,y * lVar1);
  return;
}

Assistant:

static
inline void qt_rectfill(T *dest, T value,
                        int x, int y, int width, int height, qsizetype stride)
{
    char *d = reinterpret_cast<char*>(dest + x) + y * stride;
    if (uint(stride) == (width * sizeof(T))) {
        qt_memfill(reinterpret_cast<T*>(d), value, qsizetype(width) * height);
    } else {
        for (int j = 0; j < height; ++j) {
            dest = reinterpret_cast<T*>(d);
            qt_memfill(dest, value, width);
            d += stride;
        }
    }
}